

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool operator_float_div(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_value_t gVar1;
  gravity_value_t value;
  gravity_value_t value_00;
  gravity_value_t value_01;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar2;
  gravity_fiber_t *pgVar3;
  char local_3088 [8];
  char _buffer_2 [4096];
  char local_2078 [8];
  char _buffer_1 [4096];
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 local_1070;
  char local_1058 [8];
  char _buffer [4096];
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 local_50;
  gravity_value_t v2;
  gravity_value_t v1;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  gVar1 = args[1];
  join_0x00000010_0x00000000_ = convert_value2float(vm,*args);
  aVar2.n = local_50.n;
  if (_buffer._4088_8_ == 0) {
    snprintf(local_1058,0x1000,"Unable to convert object to Float");
    pgVar3 = gravity_vm_fiber(vm);
    gravity_fiber_seterror(pgVar3,local_1058);
    value_01.field_1.n = 0;
    value_01.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_01,rindex);
    vm_local._7_1_ = false;
  }
  else {
    join_0x00000010_0x00000000_ = convert_value2float(vm,gVar1);
    if (_buffer_1._4088_8_ == 0) {
      snprintf(local_2078,0x1000,"Unable to convert object to Float");
      pgVar3 = gravity_vm_fiber(vm);
      gravity_fiber_seterror(pgVar3,local_2078);
      _buffer_2._4088_8_ = gravity_class_null;
      value_00.field_1.n = 0;
      value_00.isa = gravity_class_null;
      gravity_vm_setslot(vm,value_00,rindex);
      vm_local._7_1_ = false;
    }
    else if ((local_1070.f != 0.0) || (NAN(local_1070.f))) {
      gVar1.field_1.f = aVar2.f / local_1070.f;
      gVar1.isa = gravity_class_float;
      gravity_vm_setslot(vm,gVar1,rindex);
      vm_local._7_1_ = true;
    }
    else {
      snprintf(local_3088,0x1000,"Division by 0 error.");
      pgVar3 = gravity_vm_fiber(vm);
      gravity_fiber_seterror(pgVar3,local_3088);
      value.field_1.n = 0;
      value.isa = gravity_class_null;
      gravity_vm_setslot(vm,value,rindex);
      vm_local._7_1_ = false;
    }
  }
  return vm_local._7_1_;
}

Assistant:

static bool operator_float_div (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)

    DECLARE_2VARIABLES(v1, v2, 0, 1);
    INTERNAL_CONVERT_FLOAT(v1, true);
    INTERNAL_CONVERT_FLOAT(v2, true);

    if (v2.f == 0.0) RETURN_ERROR("Division by 0 error.");
    RETURN_VALUE(VALUE_FROM_FLOAT(v1.f / v2.f), rindex);
}